

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

UBool __thiscall
icu_63::anon_unknown_4::SortKeyLevel::ensureCapacity(SortKeyLevel *this,int32_t appendCapacity)

{
  int32_t iVar1;
  int iVar2;
  uchar *puVar3;
  int32_t local_20;
  int32_t altCapacity;
  int32_t newCapacity;
  int32_t appendCapacity_local;
  SortKeyLevel *this_local;
  
  if (this->ok == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    iVar1 = MaybeStackArray<unsigned_char,_40>::getCapacity(&this->buffer);
    iVar2 = this->len + appendCapacity * 2;
    local_20 = iVar1 << 1;
    if (iVar1 << 1 < iVar2) {
      local_20 = iVar2;
    }
    if (local_20 < 200) {
      local_20 = 200;
    }
    puVar3 = MaybeStackArray<unsigned_char,_40>::resize(&this->buffer,local_20,this->len);
    if (puVar3 == (uchar *)0x0) {
      this->ok = '\0';
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool SortKeyLevel::ensureCapacity(int32_t appendCapacity) {
    if(!ok) {
        return FALSE;
    }
    int32_t newCapacity = 2 * buffer.getCapacity();
    int32_t altCapacity = len + 2 * appendCapacity;
    if (newCapacity < altCapacity) {
        newCapacity = altCapacity;
    }
    if (newCapacity < 200) {
        newCapacity = 200;
    }
    if(buffer.resize(newCapacity, len)==NULL) {
        return ok = FALSE;
    }
    return TRUE;
}